

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

string * __thiscall
duckdb_re2::NFA::FormatCapture_abi_cxx11_(string *__return_storage_ptr__,NFA *this,char **capture)

{
  char *pcVar1;
  long lVar2;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < this->ncapture_) {
    lVar2 = 0;
    do {
      pcVar1 = capture[lVar2];
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if (capture[lVar2 + 1] == (char *)0x0) {
          StringPrintf_abi_cxx11_(&local_58,"(%td,?)",(long)pcVar1 - (long)this->btext_);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        }
        else {
          StringPrintf_abi_cxx11_
                    (&local_58,"(%td,%td)",(long)pcVar1 - (long)this->btext_,
                     (long)capture[lVar2 + 1] - (long)this->btext_);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < this->ncapture_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NFA::FormatCapture(const char** capture) {
  std::string s;
  for (int i = 0; i < ncapture_; i+=2) {
    if (capture[i] == NULL)
      s += "(?,?)";
    else if (capture[i+1] == NULL)
      s += StringPrintf("(%td,?)",
                        capture[i] - btext_);
    else
      s += StringPrintf("(%td,%td)",
                        capture[i] - btext_,
                        capture[i+1] - btext_);
  }
  return s;
}